

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idas_nls_sim.c
# Opt level: O3

int idaNlsLSolveSensSim(N_Vector deltaSim,void *ida_mem)

{
  long lVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  
  if (ida_mem == (void *)0x0) {
    iVar3 = -0x14;
    IDAProcessError((IDAMem)0x0,-0x14,0x144,"idaNlsLSolveSensSim",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/idas/idas_nls_sim.c"
                    ,"ida_mem = NULL illegal.");
  }
  else {
    iVar2 = (**(code **)((long)ida_mem + 0x748))
                      (ida_mem,**deltaSim->content,*(undefined8 *)((long)ida_mem + 0x278),
                       *(undefined8 *)((long)ida_mem + 0x280),*(undefined8 *)((long)ida_mem + 0x288)
                       ,*(undefined8 *)((long)ida_mem + 0x2b8));
    iVar3 = -7;
    if (-1 < iVar2) {
      if (iVar2 == 0) {
        if (0 < *(int *)((long)ida_mem + 0xa0)) {
          lVar1 = *deltaSim->content;
          lVar4 = 0;
          do {
            iVar3 = (**(code **)((long)ida_mem + 0x748))
                              (ida_mem,*(undefined8 *)(lVar1 + 8 + lVar4 * 8),
                               *(undefined8 *)(*(long *)((long)ida_mem + 0x380) + lVar4 * 8),
                               *(undefined8 *)((long)ida_mem + 0x280),
                               *(undefined8 *)((long)ida_mem + 0x288),
                               *(undefined8 *)((long)ida_mem + 0x2b8));
            if (iVar3 < 0) {
              return -7;
            }
            if (iVar3 != 0) goto LAB_00128a6f;
            lVar4 = lVar4 + 1;
          } while (lVar4 < *(int *)((long)ida_mem + 0xa0));
        }
        iVar3 = 0;
      }
      else {
LAB_00128a6f:
        iVar3 = 3;
      }
    }
  }
  return iVar3;
}

Assistant:

static int idaNlsLSolveSensSim(N_Vector deltaSim, void* ida_mem)
{
  IDAMem IDA_mem;
  int retval, is;
  N_Vector delta;
  N_Vector* deltaS;

  if (ida_mem == NULL)
  {
    IDAProcessError(NULL, IDA_MEM_NULL, __LINE__, __func__, __FILE__, MSG_NO_MEM);
    return (IDA_MEM_NULL);
  }
  IDA_mem = (IDAMem)ida_mem;

  /* extract state update vector from the vector wrapper */
  delta = NV_VEC_SW(deltaSim, 0);

  /* solve the state linear system */
  retval = IDA_mem->ida_lsolve(IDA_mem, delta, IDA_mem->ida_ewt, IDA_mem->ida_yy,
                               IDA_mem->ida_yp, IDA_mem->ida_savres);

  if (retval < 0) { return (IDA_LSOLVE_FAIL); }
  if (retval > 0) { return (IDA_LSOLVE_RECVR); }

  /* extract sensitivity deltas from the vector wrapper */
  deltaS = NV_VECS_SW(deltaSim) + 1;

  /* solve the sensitivity linear systems */
  for (is = 0; is < IDA_mem->ida_Ns; is++)
  {
    retval = IDA_mem->ida_lsolve(IDA_mem, deltaS[is], IDA_mem->ida_ewtS[is],
                                 IDA_mem->ida_yy, IDA_mem->ida_yp,
                                 IDA_mem->ida_savres);

    if (retval < 0) { return (IDA_LSOLVE_FAIL); }
    if (retval > 0) { return (IDA_LSOLVE_RECVR); }
  }

  return (IDA_SUCCESS);
}